

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_12a4996::TGlslangToSpvTraverser::visitSymbol
          (TGlslangToSpvTraverser *this,TIntermSymbol *symbol)

{
  Builder *this_00;
  Module *this_01;
  bool bVar1;
  pointer ppIVar2;
  Instruction *pIVar3;
  TIntermediate *this_02;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Id IVar8;
  Id IVar9;
  Id IVar10;
  Op OVar11;
  StorageClass SVar12;
  StorageClass SVar13;
  Id IVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar15;
  mapped_type *pmVar16;
  undefined4 extraout_var_04;
  long lVar17;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  iterator iVar18;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  TTypeList *pTVar19;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  iterator iVar20;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  iterator iVar21;
  undefined4 extraout_var_17;
  mapped_type *ppTVar22;
  ulong uVar23;
  char *pcVar24;
  uint typeId;
  char *pcVar25;
  SpvBuildLogger *this_03;
  Id id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> components;
  Id local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined4 extraout_var_03;
  
  if (this->linkageOnly == false) {
    iVar6 = (**(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)(symbol);
    iVar6 = *(int *)(CONCAT44(extraout_var,iVar6) + 0xc);
    iVar7 = (**(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)(symbol);
    if (*(long *)CONCAT44(extraout_var_00,iVar7) == 0) {
      pcVar24 = (char *)0x0;
    }
    else {
      pcVar24 = *(char **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 8);
    }
    spv::Builder::setDebugSourceLocation(&this->builder,iVar6,pcVar24);
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(symbol);
  if (iVar6 == 0x16) {
    return;
  }
  bVar1 = (this->builder).generatingOpCodeForSpecConst;
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 0x128))
                    ((long *)CONCAT44(extraout_var_01,iVar6));
  if (cVar4 != '\0') {
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
    iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    plVar15 = (long *)CONCAT44(extraout_var_03,iVar7);
    cVar4 = (**(code **)(*plVar15 + 0x128))(plVar15);
    if (cVar4 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)plVar15[0xd];
    pmVar16 = std::__detail::
              _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->glslangTypeToIdMap,(key_type *)&components);
    *pmVar16 = CONCAT44(extraout_var_02,iVar6);
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  lVar17 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar6) + 0x58))
                     ((long *)CONCAT44(extraout_var_04,iVar6));
  if ((*(byte *)(lVar17 + 0xc) & 1) != 0) {
    (this->builder).generatingOpCodeForSpecConst = true;
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(symbol);
  if (iVar6 == 0x1b) goto LAB_004351f7;
  id = getSymbolId(this,symbol);
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  lVar17 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar6) + 0x58))
                     ((long *)CONCAT44(extraout_var_05,iVar6));
  if ((*(uint *)(lVar17 + 8) & 0x7f) == 0xf) {
    this->taskPayloadID = id;
  }
  ppIVar2 = (this->builder).module.idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar3 = ppIVar2[id];
  if (pIVar3 == (Instruction *)0x0) {
    uVar23 = 0;
  }
  else {
    uVar23 = (ulong)pIVar3->typeId;
  }
  this_00 = &this->builder;
  IVar14 = id;
  if (ppIVar2[uVar23]->opCode == OpTypePointer) {
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar17 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar6) + 0x58))
                       ((long *)CONCAT44(extraout_var_06,iVar6));
    if ((0x13 < (*(uint *)(lVar17 + 8) & 0x7f)) ||
       ((0xd0000U >> (*(uint *)(lVar17 + 8) & 0x1f) & 1) == 0)) {
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      lVar17 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar6) + 0x58))
                         ((long *)CONCAT44(extraout_var_08,iVar6));
      if (1 < (*(uint *)(lVar17 + 8) & 0x7f) - 0x11) {
        iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
        cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar6) + 0x128))
                          ((long *)CONCAT44(extraout_var_09,iVar6));
        if (cVar4 != '\0') {
          iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
          pTVar19 = glslang::TType::getStruct((TType *)CONCAT44(extraout_var_10,iVar6));
          if ((pTVar19->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
              ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              (pTVar19->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
              ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_start) goto LAB_00434cd7;
        }
        pIVar3 = (this->builder).module.idToInstruction.
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start[id];
        if (pIVar3 == (Instruction *)0x0) {
          IVar14 = 0;
        }
        else {
          IVar14 = pIVar3->typeId;
        }
        this_01 = &(this->builder).module;
        SVar12 = spv::Module::getStorageClass(this_01,IVar14);
        if ((((0x103ff < (this->glslangIntermediate->spvVersion).spv) &&
             (pIVar3 = (this->builder).module.idToInstruction.
                       super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[id], pIVar3->opCode == OpVariable))
            && (SVar13 = spv::Module::getStorageClass(this_01,pIVar3->typeId), SVar13 != Function))
           || ((SVar12 | StorageClassUniform) == Output)) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&this->iOSet,&id);
        }
      }
    }
LAB_00434cd7:
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar17 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar6) + 0x58))
                       ((long *)CONCAT44(extraout_var_07,iVar6));
    IVar14 = id;
    if ((*(uint *)(lVar17 + 8) & 0x7f) == 3) {
      local_50._M_dataplus._M_p._0_4_ = id;
      iVar18 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->forceType)._M_h,(key_type_conflict *)&local_50);
      IVar14 = (Id)local_50._M_dataplus._M_p;
      if (iVar18.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
          _M_cur != (__node_type *)0x0) {
        ppIVar2 = (this->builder).module.idToInstruction.
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pIVar3 = ppIVar2[(Id)local_50._M_dataplus._M_p];
        if (pIVar3 == (Instruction *)0x0) {
          typeId = 0;
        }
        else {
          typeId = pIVar3->typeId;
        }
        if (ppIVar2[typeId]->opCode != OpTypePointer) {
          __assert_fail("builder.isPointerType(objectTypeId)",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                        ,0x9ea,
                        "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::translateForcedType(spv::Id)"
                       );
        }
        IVar14 = *(Id *)((long)iVar18.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                               ._M_cur + 0xc);
        IVar8 = spv::Builder::getContainedTypeId(this_00,typeId);
        OVar11 = (this->builder).module.idToInstruction.
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start[IVar8]->opCode;
        if (OVar11 == OpTypeVector) {
          IVar9 = spv::Builder::getContainedTypeId(this_00,IVar8);
          iVar6 = spv::Builder::getScalarTypeWidth(this_00,IVar9);
          if (iVar6 != 0x20) {
            OVar11 = (this->builder).module.idToInstruction.
                     super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[IVar8]->opCode;
            goto LAB_00434f05;
          }
          iVar6 = spv::Builder::getScalarTypeWidth(this_00,IVar14);
          if (iVar6 == 0x40) {
            spv::Builder::clearAccessChain(this_00);
            spv::Builder::setAccessChainLValue(this_00,(Id)local_50._M_dataplus._M_p);
            IVar9 = spv::Builder::accessChainLoad
                              (this_00,DecorationMax,DecorationMax,DecorationMax,IVar8,MaskNone,Max,
                               0);
            components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_50._M_dataplus._M_p._0_4_ = IVar9;
            IVar10 = spv::Builder::getContainedTypeId(this_00,IVar8);
            local_54 = spv::Builder::createCompositeExtract(this_00,IVar9,IVar10,0);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(&components,(iterator)0x0,&local_54);
            IVar9 = (Id)local_50._M_dataplus._M_p;
            IVar10 = spv::Builder::getContainedTypeId(this_00,IVar8);
            local_54 = spv::Builder::createCompositeExtract(this_00,IVar9,IVar10,1);
            if (components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&components,
                         (iterator)
                         components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_54);
            }
            else {
              *components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_54;
              components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            IVar8 = spv::Builder::getContainedTypeId(this_00,IVar8);
            IVar8 = spv::Builder::makeVectorType(this_00,IVar8,2);
            IVar8 = spv::Builder::createCompositeConstruct(this_00,IVar8,&components);
            IVar14 = spv::Builder::createUnaryOp(this_00,OpBitcast,IVar14,IVar8);
            if (components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(components.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)components.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)components.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_00434fd2;
          }
          this_03 = this->logger;
          pcVar25 = "forcing 32-bit vector type to non 64-bit scalar";
          pcVar24 = "";
        }
        else {
LAB_00434f05:
          if (OVar11 == OpTypeMatrix) {
            spv::Builder::clearAccessChain(this_00);
            spv::Builder::setAccessChainLValue(this_00,(Id)local_50._M_dataplus._M_p);
            local_50._M_dataplus._M_p._0_4_ =
                 spv::Builder::accessChainLoad
                           (this_00,DecorationMax,DecorationMax,DecorationMax,IVar8,MaskNone,Max,0);
            IVar14 = spv::Builder::createUnaryOp
                               (this_00,OpTranspose,IVar14,(Id)local_50._M_dataplus._M_p);
            goto LAB_00434fd2;
          }
          this_03 = this->logger;
          pcVar25 = "forcing non 32-bit vector type";
          pcVar24 = "";
        }
        components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>((string *)&components,pcVar25,pcVar24);
        spv::SpvBuildLogger::missingFunctionality(this_03,(string *)&components);
        IVar14 = (Id)local_50._M_dataplus._M_p;
        if ((pointer *)
            components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)components.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          IVar14 = (Id)local_50._M_dataplus._M_p;
        }
      }
    }
  }
LAB_00434fd2:
  id = IVar14;
  if ((this->linkageOnly != true) ||
     (iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(symbol),
     (*(ulong *)(CONCAT44(extraout_var_11,iVar6) + 8) & 0x100000000) != 0)) {
    spv::Builder::clearAccessChain(this_00);
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(symbol);
    if ((*(ulong *)(CONCAT44(extraout_var_12,iVar6) + 8) & 0x100000000) == 0) {
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
      components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var_13,iVar6);
      iVar20 = std::
               _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(&(this->rValueParameters)._M_h,(key_type_conflict2 *)&components);
      if (iVar20.super__Node_iterator_base<long_long,_false>._M_cur == (__node_type *)0x0) {
        ppIVar2 = (this->builder).module.idToInstruction.
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pIVar3 = ppIVar2[id];
        if (pIVar3 == (Instruction *)0x0) {
          uVar23 = 0;
        }
        else {
          uVar23 = (ulong)pIVar3->typeId;
        }
        if (ppIVar2[uVar23]->opCode == OpTypePointer) {
          spv::Builder::setAccessChainLValue(this_00,id);
          goto LAB_0043504e;
        }
      }
    }
    (this->builder).accessChain.isRValue = true;
    (this->builder).accessChain.base = id;
  }
LAB_0043504e:
  if ((this->linkageOnly == true) && (this->glslangIntermediate->hlslFunctionality1 == true)) {
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar17 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar6) + 0x58))
                       ((long *)CONCAT44(extraout_var_14,iVar6));
    if ((*(uint *)(lVar17 + 8) & 0x7f) - 5 < 2) {
      this_02 = this->glslangIntermediate;
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
      bVar5 = glslang::TIntermediate::hasCounterBufferName
                        (this_02,(TString *)CONCAT44(extraout_var_15,iVar6));
      if (bVar5) {
        iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&components,*(char **)(CONCAT44(extraout_var_16,iVar6) + 8),
                   (allocator<char> *)&local_50);
        iVar21 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->counterOriginator)._M_h,(key_type *)&components);
        if (((iVar21.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_true>
              ._M_cur != (__node_type *)0x0) &&
            (id = getSymbolId(this,*(TIntermSymbol **)
                                    ((long)iVar21.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_true>
                                           ._M_cur + 0x28)), id != 0)) &&
           (IVar14 = getSymbolId(this,symbol), IVar14 != 0)) {
          spv::Builder::addExtension(this_00,"SPV_GOOGLE_hlsl_functionality1");
          spv::Builder::addDecorationId(this_00,id,CounterBuffer,IVar14);
        }
      }
      else {
        iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&components,*(char **)(CONCAT44(extraout_var_17,iVar6) + 8),
                   (allocator<char> *)&local_50);
        glslang::TIntermediate::addCounterBufferName<std::__cxx11::string>
                  (&local_50,this->glslangIntermediate,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&components)
        ;
        std::__cxx11::string::operator=((string *)&components,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(Id)local_50._M_dataplus._M_p) !=
            &local_50.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_50._M_dataplus._M_p._4_4_,(Id)local_50._M_dataplus._M_p),
                          local_50.field_2._M_allocated_capacity + 1);
        }
        ppTVar22 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&this->counterOriginator,(key_type *)&components);
        *ppTVar22 = symbol;
      }
      if ((pointer *)
          components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)components.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
    }
  }
LAB_004351f7:
  (this->builder).generatingOpCodeForSpecConst = bVar1;
  return;
}

Assistant:

void TGlslangToSpvTraverser::visitSymbol(glslang::TIntermSymbol* symbol)
{
    // We update the line information even though no code might be generated here
    // This is helpful to yield correct lines for control flow instructions
    if (!linkageOnly) {
        builder.setDebugSourceLocation(symbol->getLoc().line, symbol->getLoc().getFilename());
    }

    if (symbol->getBasicType() == glslang::EbtFunction) {
        return;
    }

    SpecConstantOpModeGuard spec_constant_op_mode_setter(&builder);
    if (symbol->getType().isStruct())
        glslangTypeToIdMap[symbol->getType().getStruct()] = symbol->getId();

    if (symbol->getType().getQualifier().isSpecConstant())
        spec_constant_op_mode_setter.turnOnSpecConstantOpMode();
#ifdef ENABLE_HLSL
    // Skip symbol handling if it is string-typed
    if (symbol->getBasicType() == glslang::EbtString)
        return;
#endif

    // getSymbolId() will set up all the IO decorations on the first call.
    // Formal function parameters were mapped during makeFunctions().
    spv::Id id = getSymbolId(symbol);

    if (symbol->getType().getQualifier().isTaskPayload())
        taskPayloadID = id; // cache the taskPayloadID to be used it as operand for OpEmitMeshTasksEXT

    if (builder.isPointer(id)) {
        if (!symbol->getType().getQualifier().isParamInput() &&
            !symbol->getType().getQualifier().isParamOutput()) {
            // Include all "static use" and "linkage only" interface variables on the OpEntryPoint instruction
            // Consider adding to the OpEntryPoint interface list.
            // Only looking at structures if they have at least one member.
            if (!symbol->getType().isStruct() || symbol->getType().getStruct()->size() > 0) {
                spv::StorageClass sc = builder.getStorageClass(id);
                // Before SPIR-V 1.4, we only want to include Input and Output.
                // Starting with SPIR-V 1.4, we want all globals.
                if ((glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_4 && builder.isGlobalVariable(id)) ||
                    (sc == spv::StorageClassInput || sc == spv::StorageClassOutput)) {
                    iOSet.insert(id);
                }
            }
        }

        // If the SPIR-V type is required to be different than the AST type
        // (for ex SubgroupMasks or 3x4 ObjectToWorld/WorldToObject matrices),
        // translate now from the SPIR-V type to the AST type, for the consuming
        // operation.
        // Note this turns it from an l-value to an r-value.
        // Currently, all symbols needing this are inputs; avoid the map lookup when non-input.
        if (symbol->getType().getQualifier().storage == glslang::EvqVaryingIn)
            id = translateForcedType(id);
    }

    // Only process non-linkage-only nodes for generating actual static uses
    if (! linkageOnly || symbol->getQualifier().isSpecConstant()) {
        // Prepare to generate code for the access

        // L-value chains will be computed left to right.  We're on the symbol now,
        // which is the left-most part of the access chain, so now is "clear" time,
        // followed by setting the base.
        builder.clearAccessChain();

        // For now, we consider all user variables as being in memory, so they are pointers,
        // except for
        // A) R-Value arguments to a function, which are an intermediate object.
        //    See comments in handleUserFunctionCall().
        // B) Specialization constants (normal constants don't even come in as a variable),
        //    These are also pure R-values.
        // C) R-Values from type translation, see above call to translateForcedType()
        glslang::TQualifier qualifier = symbol->getQualifier();
        if (qualifier.isSpecConstant() || rValueParameters.find(symbol->getId()) != rValueParameters.end() ||
            !builder.isPointerType(builder.getTypeId(id)))
            builder.setAccessChainRValue(id);
        else
            builder.setAccessChainLValue(id);
    }

#ifdef ENABLE_HLSL
    // Process linkage-only nodes for any special additional interface work.
    if (linkageOnly) {
        if (glslangIntermediate->getHlslFunctionality1()) {
            // Map implicit counter buffers to their originating buffers, which should have been
            // seen by now, given earlier pruning of unused counters, and preservation of order
            // of declaration.
            if (symbol->getType().getQualifier().isUniformOrBuffer()) {
                if (!glslangIntermediate->hasCounterBufferName(symbol->getName())) {
                    // Save possible originating buffers for counter buffers, keyed by
                    // making the potential counter-buffer name.
                    std::string keyName = symbol->getName().c_str();
                    keyName = glslangIntermediate->addCounterBufferName(keyName);
                    counterOriginator[keyName] = symbol;
                } else {
                    // Handle a counter buffer, by finding the saved originating buffer.
                    std::string keyName = symbol->getName().c_str();
                    auto it = counterOriginator.find(keyName);
                    if (it != counterOriginator.end()) {
                        id = getSymbolId(it->second);
                        if (id != spv::NoResult) {
                            spv::Id counterId = getSymbolId(symbol);
                            if (counterId != spv::NoResult) {
                                builder.addExtension("SPV_GOOGLE_hlsl_functionality1");
                                builder.addDecorationId(id, spv::DecorationHlslCounterBufferGOOGLE, counterId);
                            }
                        }
                    }
                }
            }
        }
    }
#endif
}